

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

int __thiscall
pstore::brokerface::channel<std::condition_variable>::listen_abi_cxx11_
          (channel<std::condition_variable> *this,int __fd,int __n)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  unique_lock<std::mutex> lock;
  string message;
  unique_lock<std::mutex> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_register_00000014,__n);
  std::unique_lock<std::mutex>::unique_lock
            (&local_50,(mutex_type *)CONCAT44(in_register_00000034,__fd));
  do {
    if ((char)this_00[1].
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size != '\x01') {
      *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
      (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
      ;
      (this->mut_).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
      (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
      ;
LAB_00115b06:
      std::unique_lock<std::mutex>::~unique_lock(&local_50);
      return (int)this;
    }
    sVar1 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_00);
    if (sVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&local_40,
                 (string *)
                 (this_00->
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(this_00);
      maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string_const&,void>
                ((maybe<std::__cxx11::string,void> *)this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00115b06;
    }
    std::condition_variable::wait
              ((unique_lock *)
               ((mutex_type *)CONCAT44(in_register_00000034,__fd))[1].super___mutex_base._M_mutex.
               __align);
  } while( true );
}

Assistant:

maybe<std::string> channel<ConditionVariable>::listen (subscriber_type & sub) {
            std::unique_lock<std::mutex> lock{mut_};
            while (sub.active_) {
                if (sub.queue_.size () == 0) {
                    cv_->wait (lock);
                } else {
                    std::string const message = std::move (sub.queue_.front ());
                    sub.queue_.pop ();
                    return just (message);
                }
            }
            return nothing<std::string> ();
        }